

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O3

AddressFactory * __thiscall
cfd::AddressFactory::GetAddressByLockingScript(AddressFactory *this,Script *locking_script)

{
  int iVar1;
  ByteData BVar2;
  char cVar3;
  ScriptOperator *this_00;
  long lVar4;
  CfdException *this_01;
  Pubkey pubkey;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  undefined8 in_stack_ffffffffffffff58;
  _Alloc_hider in_stack_ffffffffffffff60;
  pointer in_stack_ffffffffffffff68;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_80;
  void *local_68;
  void *local_50 [3];
  void *local_38;
  
  cfd::core::Script::GetElementList();
  cVar3 = cfd::core::Script::IsP2pkScript();
  if (cVar3 == '\0') {
    cVar3 = cfd::core::Script::IsP2pkhScript();
    if (cVar3 == '\0') {
      cVar3 = cfd::core::Script::IsP2shScript();
      if (cVar3 == '\0') {
        cVar3 = cfd::core::Script::IsP2wpkhScript();
        if (cVar3 == '\0') {
          cVar3 = cfd::core::Script::IsP2wshScript();
          if (cVar3 == '\0') {
            cVar3 = cfd::core::Script::IsTaprootScript();
            if (cVar3 == '\0') {
              cVar3 = cfd::core::Script::IsWitnessProgram();
              if (cVar3 != '\0') {
                this_00 = (ScriptOperator *)cfd::core::ScriptElement::GetOpCode();
                cVar3 = cfd::core::ScriptOperator::operator!=
                                  (this_00,(ScriptOperator *)&core::ScriptOperator::OP_0);
                if (cVar3 != '\0') {
                  lVar4 = cfd::core::ScriptElement::GetOpCode();
                  iVar1 = *(int *)(lVar4 + 8);
                  cfd::core::ScriptElement::GetBinaryData();
                  cfd::core::Address::Address
                            ((Address *)this,
                             *(NetType *)
                              &(locking_script->script_data_).data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                             (iVar1 + 0xafU & 0xff) + kVersion1,(ByteData *)&stack0xffffffffffffff60
                             ,(vector *)
                              &(locking_script->script_data_).data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
                  goto LAB_001df4d6;
                }
              }
              cVar3 = cfd::core::Script::IsMultisigScript();
              this_01 = (CfdException *)__cxa_allocate_exception(0x30);
              if (cVar3 != '\0') {
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&stack0xffffffffffffff60,"script type is multisig script.","");
                core::CfdException::CfdException
                          (this_01,kCfdIllegalArgumentError,(string *)&stack0xffffffffffffff60);
                __cxa_throw(this_01,&core::CfdException::typeinfo,core::CfdException::~CfdException)
                ;
              }
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xffffffffffffff60,"unknown type locking script.","");
              core::CfdException::CfdException
                        (this_01,kCfdIllegalArgumentError,(string *)&stack0xffffffffffffff60);
              __cxa_throw(this_01,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            cfd::core::ScriptElement::GetBinaryData();
            cfd::core::Address::Address
                      ((Address *)this,
                       *(NetType *)
                        &(locking_script->script_data_).data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,kVersion1,
                       (ByteData *)&stack0xffffffffffffff60,
                       (vector *)
                       &(locking_script->script_data_).data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish);
            goto LAB_001df4d6;
          }
        }
        cfd::core::ScriptElement::GetBinaryData();
        cfd::core::Address::Address
                  ((Address *)this,
                   *(NetType *)
                    &(locking_script->script_data_).data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   *(WitnessVersion *)
                    ((long)&(locking_script->script_data_).data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 4),
                   (ByteData *)&stack0xffffffffffffff60,
                   (vector *)
                   &(locking_script->script_data_).data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      }
      else {
        cfd::core::ScriptElement::GetBinaryData();
        cfd::core::ByteData::GetBytes();
        cfd::core::ByteData160::ByteData160
                  ((ByteData160 *)&stack0xffffffffffffff60,(vector *)local_50);
        if (local_50[0] != (void *)0x0) {
          operator_delete(local_50[0]);
        }
        if (local_68 != (void *)0x0) {
          operator_delete(local_68);
        }
        cfd::core::Address::Address
                  ((Address *)this,
                   *(NetType *)
                    &(locking_script->script_data_).data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,kP2shAddress,
                   (ByteData160 *)&stack0xffffffffffffff60,
                   (vector *)
                   &(locking_script->script_data_).data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
      }
    }
    else {
      cfd::core::ScriptElement::GetBinaryData();
      cfd::core::ByteData::GetBytes();
      cfd::core::ByteData160::ByteData160
                ((ByteData160 *)&stack0xffffffffffffff60,(vector *)local_50);
      if (local_50[0] != (void *)0x0) {
        operator_delete(local_50[0]);
      }
      if (local_68 != (void *)0x0) {
        operator_delete(local_68);
      }
      cfd::core::Address::Address
                ((Address *)this,
                 *(NetType *)
                  &(locking_script->script_data_).data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,kP2pkhAddress,
                 (ByteData160 *)&stack0xffffffffffffff60,
                 (vector *)
                 &(locking_script->script_data_).data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
    }
  }
  else {
    cfd::core::ScriptElement::GetBinaryData();
    BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff60._M_p;
    BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff58;
    BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffff68;
    cfd::core::Pubkey::Pubkey((Pubkey *)&stack0xffffffffffffff60,BVar2);
    if (local_38 != (void *)0x0) {
      operator_delete(local_38);
    }
    cfd::core::Address::Address
              ((Address *)this,
               *(NetType *)
                &(locking_script->script_data_).data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,(Pubkey *)&stack0xffffffffffffff60,
               (vector *)
               &(locking_script->script_data_).data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish);
  }
LAB_001df4d6:
  if ((pointer)in_stack_ffffffffffffff60._M_p != (pointer)0x0) {
    operator_delete(in_stack_ffffffffffffff60._M_p);
  }
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_80);
  return this;
}

Assistant:

Address AddressFactory::GetAddressByLockingScript(
    const Script& locking_script) const {
  std::vector<ScriptElement> items = locking_script.GetElementList();
  if (locking_script.IsP2pkScript()) {
    Pubkey pubkey = Pubkey(items[0].GetBinaryData());
    return CreateP2pkhAddress(pubkey);
  } else if (locking_script.IsP2pkhScript()) {
    ByteData160 hash = ByteData160(items[2].GetBinaryData().GetBytes());
    return GetAddressByHash(AddressType::kP2pkhAddress, hash);
  } else if (locking_script.IsP2shScript()) {
    ByteData160 hash = ByteData160(items[1].GetBinaryData().GetBytes());
    return GetAddressByHash(AddressType::kP2shAddress, hash);
  } else if (
      locking_script.IsP2wpkhScript() || locking_script.IsP2wshScript()) {
    return GetSegwitAddressByHash(items[1].GetBinaryData());
  } else if (locking_script.IsTaprootScript()) {
    return GetSegwitAddressByHash(
        items[1].GetBinaryData(), WitnessVersion::kVersion1);
  } else if (
      locking_script.IsWitnessProgram() &&
      (items[0].GetOpCode() != ScriptOperator::OP_0)) {
    uint8_t var = items[0].GetOpCode().GetDataType() - ScriptType::kOp_1;
    return GetSegwitAddressByHash(
        items[1].GetBinaryData(), static_cast<WitnessVersion>(var + 1));
  } else if (locking_script.IsMultisigScript()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "script type is multisig script.");
  } else {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "unknown type locking script.");
  }
}